

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngget.c
# Opt level: O0

png_uint_32
png_get_tRNS(png_const_structrp png_ptr,png_inforp info_ptr,png_bytep *trans_alpha,int *num_trans,
            png_color_16p *trans_color)

{
  png_uint_32 local_34;
  png_uint_32 retval;
  png_color_16p *trans_color_local;
  int *num_trans_local;
  png_bytep *trans_alpha_local;
  png_inforp info_ptr_local;
  png_const_structrp png_ptr_local;
  
  local_34 = 0;
  if (((png_ptr != (png_const_structrp)0x0) && (info_ptr != (png_inforp)0x0)) &&
     ((info_ptr->valid & 0x10) != 0)) {
    if (info_ptr->color_type == '\x03') {
      if (trans_alpha != (png_bytep *)0x0) {
        *trans_alpha = info_ptr->trans_alpha;
        local_34 = 0x10;
      }
      if (trans_color != (png_color_16p *)0x0) {
        *trans_color = &info_ptr->trans_color;
      }
    }
    else {
      if (trans_color != (png_color_16p *)0x0) {
        *trans_color = &info_ptr->trans_color;
        local_34 = 0x10;
      }
      if (trans_alpha != (png_bytep *)0x0) {
        *trans_alpha = (png_bytep)0x0;
      }
    }
    if (num_trans != (int *)0x0) {
      *num_trans = (uint)info_ptr->num_trans;
      local_34 = 0x10;
    }
  }
  return local_34;
}

Assistant:

png_uint_32 PNGAPI
png_get_tRNS(png_const_structrp png_ptr, png_inforp info_ptr,
    png_bytep *trans_alpha, int *num_trans, png_color_16p *trans_color)
{
   png_uint_32 retval = 0;
   if (png_ptr != NULL && info_ptr != NULL &&
       (info_ptr->valid & PNG_INFO_tRNS) != 0)
   {
      png_debug1(1, "in %s retrieval function", "tRNS");

      if (info_ptr->color_type == PNG_COLOR_TYPE_PALETTE)
      {
         if (trans_alpha != NULL)
         {
            *trans_alpha = info_ptr->trans_alpha;
            retval |= PNG_INFO_tRNS;
         }

         if (trans_color != NULL)
            *trans_color = &(info_ptr->trans_color);
      }

      else /* if (info_ptr->color_type != PNG_COLOR_TYPE_PALETTE) */
      {
         if (trans_color != NULL)
         {
            *trans_color = &(info_ptr->trans_color);
            retval |= PNG_INFO_tRNS;
         }

         if (trans_alpha != NULL)
            *trans_alpha = NULL;
      }

      if (num_trans != NULL)
      {
         *num_trans = info_ptr->num_trans;
         retval |= PNG_INFO_tRNS;
      }
   }

   return (retval);
}